

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint32_t n;
  uint uVar1;
  scoped_padder p;
  scoped_padder local_40;
  
  n = (msg->source).line;
  if (n != 0) {
    uVar1 = fmt::v6::internal::count_digits(n);
    scoped_padder::scoped_padder(&local_40,(ulong)uVar1,&(this->super_flag_formatter).padinfo_,dest)
    ;
    fmt_helper::append_int<int>((msg->source).line,dest);
    scoped_padder::~scoped_padder(&local_40);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }

        auto field_size = ScopedPadder::count_digits(msg.source.line);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.source.line, dest);
    }